

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void __thiscall Provider::Provider(Provider *this,shared_ptr<Buffer> *b)

{
  QPDFObjectHandle::StreamDataProvider::StreamDataProvider(&this->super_StreamDataProvider,false);
  *(undefined ***)this = &PTR__Provider_0014f8f0;
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->b).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>,
             &b->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  this->bad_length = false;
  return;
}

Assistant:

Provider(std::shared_ptr<Buffer> b) :
        b(b)
    {
    }